

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

bool __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this,
          AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *other)

{
  bool bVar1;
  uint local_24;
  uint32_t i;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *other_local;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this_local;
  
  if (this->size == other->size) {
    for (local_24 = 0; local_24 < this->size; local_24 = local_24 + 1) {
      bVar1 = ComplexArray::RepeatedGroup::operator==
                        (this->items + local_24,other->items + local_24);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator== (const AllocatedVector& other) const
    {
        if (size != other.size)
            return false;

        for (decltype (size) i = 0; i < size; ++i)
            if (! (items[i] == other.items[i]))
                return false;

        return true;
    }